

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::FboRenderTestGroup::init(FboRenderTestGroup *this,EVP_PKEY_CTX *ctx)

{
  GLenum GVar1;
  Context *pCVar2;
  _func_int **pp_Var3;
  bool bVar4;
  GLenum GVar5;
  int extraout_EAX;
  TestNode *pTVar6;
  TestNode *pTVar7;
  long lVar8;
  MixTest *pMVar9;
  BlendTest *pBVar10;
  IntersectingQuadsTest *pIVar11;
  StencilTest *pSVar12;
  RecreateBuffersTest<16384U> *pRVar13;
  RecreateBuffersTest<256U> *pRVar14;
  RecreateBuffersTest<1024U> *pRVar15;
  TestNode *pTVar16;
  uint uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  bool bVar20;
  bool bVar21;
  int iVar22;
  int colorbufferNdx;
  long lVar23;
  byte bVar24;
  bool bVar25;
  undefined8 uVar26;
  FboConfig local_90;
  undefined1 local_78 [24];
  undefined8 uStack_60;
  FboConfig local_58;
  long local_40;
  TestNode *local_38;
  
  pTVar6 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,pCVar2->m_testCtx,"color_clear","Color buffer clears");
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00772800;
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  local_38 = (TestNode *)this;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  lVar23 = 0;
  do {
    local_78._0_8_ = *(undefined8 *)(&DAT_00656040 + lVar23 * 2);
    local_78._8_8_ = 0;
    lVar8 = 0;
    bVar4 = true;
    do {
      bVar21 = bVar4;
      uStack_60 = (&DAT_006560d0)[lVar8];
      local_78._16_8_ = local_78._0_8_;
      lVar8 = 0;
      bVar4 = true;
      do {
        bVar25 = bVar4;
        local_90.colorbufferType = local_78._16_4_;
        local_90.colorbufferFormat = local_78._20_4_;
        local_90.depthbufferType = (GLenum)uStack_60;
        local_90.depthbufferFormat = uStack_60._4_4_;
        local_90._16_8_ = (&DAT_006560e0)[lVar8];
        pTVar7 = (TestNode *)operator_new(0x90);
        FboCases::ColorClearsTest::ColorClearsTest
                  ((ColorClearsTest *)pTVar7,(Context *)pTVar6[1]._vptr_TestNode,&local_90);
        tcu::TestNode::addChild(pTVar6,pTVar7);
        lVar8 = 1;
        bVar4 = false;
      } while (bVar25);
      bVar4 = false;
    } while (bVar21);
    lVar23 = lVar23 + 1;
  } while (lVar23 != 5);
  pTVar7 = (TestNode *)operator_new(0x78);
  pTVar6 = local_38;
  pp_Var3 = local_38[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,(TestContext *)*pp_Var3,"stencil_clear","Stencil buffer clears"
            );
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00772800;
  pTVar7[1]._vptr_TestNode = pp_Var3;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  lVar23 = 0;
  do {
    local_78._0_8_ = *(undefined8 *)(&DAT_00656040 + lVar23 * 2);
    local_78._8_8_ = 0;
    lVar8 = 0;
    bVar4 = true;
    do {
      bVar21 = bVar4;
      uStack_60 = (&DAT_006560d0)[lVar8];
      local_78._16_8_ = local_78._0_8_;
      lVar8 = 0;
      bVar4 = true;
      do {
        bVar25 = bVar4;
        local_90.colorbufferType = local_78._16_4_;
        local_90.colorbufferFormat = local_78._20_4_;
        local_90.depthbufferType = (GLenum)uStack_60;
        local_90.depthbufferFormat = uStack_60._4_4_;
        local_90._16_8_ = (&DAT_006560e0)[lVar8];
        if (local_90.stencilbufferType != 0) {
          pTVar6 = (TestNode *)operator_new(0x90);
          FboCases::StencilClearsTest::StencilClearsTest
                    ((StencilClearsTest *)pTVar6,(Context *)pTVar7[1]._vptr_TestNode,&local_90);
          tcu::TestNode::addChild(pTVar7,pTVar6);
        }
        lVar8 = 1;
        bVar4 = false;
      } while (bVar25);
      bVar4 = false;
    } while (bVar21);
    lVar23 = lVar23 + 1;
  } while (lVar23 != 5);
  pTVar7 = (TestNode *)operator_new(0x78);
  pTVar6 = local_38;
  pp_Var3 = local_38[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,(TestContext *)*pp_Var3,"color","Color buffer tests");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00772800;
  pTVar7[1]._vptr_TestNode = pp_Var3;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  local_58._0_8_ = 0;
  do {
    local_78._0_8_ = *(undefined8 *)(&DAT_00656040 + local_58._0_8_ * 2);
    local_78._8_8_ = 0;
    iVar22 = (int)local_78._0_8_;
    lVar23 = 0;
    bVar4 = true;
    do {
      bVar21 = bVar4;
      local_90._8_8_ = (&DAT_006560d0)[lVar23];
      lVar23 = 0;
      local_78._16_8_ = local_78._0_8_;
      bVar4 = true;
      local_90._0_8_ = local_78._0_8_;
      uStack_60 = local_90._8_8_;
      do {
        bVar25 = bVar4;
        local_90._16_8_ = (&DAT_006560e0)[lVar23];
        if (local_90.stencilbufferType == 0 && iVar22 == 0xde1) {
          pMVar9 = (MixTest *)operator_new(0xa0);
          FboCases::MixTest::MixTest(pMVar9,(Context *)pTVar7[1]._vptr_TestNode,&local_90,false);
          tcu::TestNode::addChild(pTVar7,(TestNode *)pMVar9);
          local_90._0_8_ = local_78._16_8_;
          local_90._8_8_ = uStack_60;
        }
        lVar23 = 1;
        bVar4 = false;
      } while (bVar25);
      bVar4 = false;
    } while (bVar21);
    local_58._0_8_ = local_58._0_8_ + 1;
  } while (local_58._0_8_ != 5);
  lVar23 = 0;
  do {
    local_58._0_8_ = *(undefined8 *)(&DAT_00656040 + lVar23 * 2);
    local_58.depthbufferType = 0;
    local_58.depthbufferFormat = 0;
    uVar18 = CONCAT71((int7)((ulong)lVar23 >> 8),1);
    GVar5 = local_58.colorbufferType;
    lVar8 = 0;
    local_40 = lVar23;
    do {
      local_78._0_4_ = (int)uVar18;
      local_90._8_8_ = (&DAT_006560d0)[lVar8];
      lVar8 = 0;
      local_78._16_4_ = local_58.colorbufferType;
      local_78._20_4_ = local_58.colorbufferFormat;
      bVar4 = true;
      local_90._0_8_ = local_58._0_8_;
      uStack_60 = local_90._8_8_;
      do {
        bVar21 = bVar4;
        local_90._16_8_ = (&DAT_006560e0)[lVar8];
        if (local_90.stencilbufferType == 0 && GVar5 == 0xde1) {
          pMVar9 = (MixTest *)operator_new(0xa0);
          FboCases::MixTest::MixTest(pMVar9,(Context *)pTVar7[1]._vptr_TestNode,&local_90,true);
          (pMVar9->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
               = (_func_int **)&PTR__TestCase_0077d048;
          tcu::TestNode::addChild(pTVar7,(TestNode *)pMVar9);
          local_90._0_8_ = local_78._16_8_;
          local_90._8_8_ = uStack_60;
        }
        lVar8 = 1;
        bVar4 = false;
      } while (bVar21);
      uVar18 = 0;
    } while ((local_78._0_8_ & 1) != 0);
    lVar23 = local_40 + 1;
  } while (lVar23 != 5);
  lVar23 = 0;
  do {
    local_78._0_8_ = *(undefined8 *)(&DAT_00656040 + lVar23 * 2);
    local_78._8_8_ = 0;
    lVar8 = 0;
    bVar4 = true;
    do {
      bVar21 = bVar4;
      local_90._8_8_ = (&DAT_006560d0)[lVar8];
      lVar8 = 0;
      local_78._16_8_ = local_78._0_8_;
      bVar4 = true;
      local_90._0_8_ = local_78._0_8_;
      uStack_60 = local_90._8_8_;
      do {
        bVar25 = bVar4;
        local_90._16_8_ = (&DAT_006560e0)[lVar8];
        if (local_90.stencilbufferType == 0) {
          pBVar10 = (BlendTest *)operator_new(0x98);
          FboCases::BlendTest::BlendTest
                    (pBVar10,(Context *)pTVar7[1]._vptr_TestNode,&local_90,false);
          tcu::TestNode::addChild(pTVar7,(TestNode *)pBVar10);
          local_90._0_8_ = local_78._16_8_;
          local_90._8_8_ = uStack_60;
        }
        lVar8 = 1;
        bVar4 = false;
      } while (bVar25);
      bVar4 = false;
    } while (bVar21);
    lVar23 = lVar23 + 1;
  } while (lVar23 != 5);
  lVar23 = 0;
  do {
    local_78._0_8_ = *(undefined8 *)(&DAT_00656040 + lVar23 * 2);
    local_78._8_8_ = 0;
    lVar8 = 0;
    bVar4 = true;
    local_58._0_8_ = lVar23;
    do {
      bVar21 = bVar4;
      uVar18 = (&DAT_006560d0)[lVar8];
      lVar8 = 0;
      local_78._16_8_ = local_78._0_8_;
      bVar4 = true;
      uVar19 = local_78._0_8_;
      uStack_60 = uVar18;
      do {
        bVar25 = bVar4;
        local_90._16_8_ = (&DAT_006560e0)[lVar8];
        local_90._0_8_ = uVar19;
        local_90._8_8_ = uVar18;
        if (local_90.stencilbufferType == 0) {
          pBVar10 = (BlendTest *)operator_new(0x98);
          FboCases::BlendTest::BlendTest(pBVar10,(Context *)pTVar7[1]._vptr_TestNode,&local_90,true)
          ;
          (pBVar10->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
               = (_func_int **)&PTR__TestCase_0077d0a0;
          tcu::TestNode::addChild(pTVar7,(TestNode *)pBVar10);
          uVar19 = local_78._16_8_;
          uVar18 = uStack_60;
        }
        lVar8 = 1;
        bVar4 = false;
      } while (bVar25);
      bVar4 = false;
    } while (bVar21);
    lVar23 = local_58._0_8_ + 1;
  } while (lVar23 != 5);
  pTVar7 = (TestNode *)operator_new(0x78);
  pTVar6 = local_38;
  pp_Var3 = local_38[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,(TestContext *)*pp_Var3,"depth","Depth bufer tests");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00772800;
  pTVar7[1]._vptr_TestNode = pp_Var3;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  local_58._0_8_ = 0;
  do {
    local_78._0_8_ = *(undefined8 *)(&DAT_00656040 + local_58._0_8_ * 2);
    local_78._8_8_ = 0;
    lVar23 = 0;
    bVar4 = true;
    do {
      bVar21 = bVar4;
      uVar18 = (&DAT_006560d0)[lVar23];
      lVar23 = 0;
      local_78._16_8_ = local_78._0_8_;
      bVar4 = true;
      local_90._0_8_ = local_78._0_8_;
      local_90._8_8_ = uVar18;
      uStack_60 = uVar18;
      do {
        bVar25 = bVar4;
        local_90._16_8_ = (&DAT_006560e0)[lVar23];
        if (local_90.stencilbufferType == 0 && (GLenum)uVar18 != 0) {
          pIVar11 = (IntersectingQuadsTest *)operator_new(0x98);
          FboCases::IntersectingQuadsTest::IntersectingQuadsTest
                    (pIVar11,(Context *)pTVar7[1]._vptr_TestNode,&local_90,false);
          tcu::TestNode::addChild(pTVar7,(TestNode *)pIVar11);
          local_90._0_8_ = local_78._16_8_;
          local_90._8_8_ = uStack_60;
        }
        lVar23 = 1;
        bVar4 = false;
      } while (bVar25);
      bVar4 = false;
    } while (bVar21);
    local_58._0_8_ = local_58._0_8_ + 1;
  } while (local_58._0_8_ != 5);
  lVar23 = 0;
  do {
    local_78._0_8_ = *(undefined8 *)(&DAT_00656040 + lVar23 * 2);
    local_78._8_8_ = 0;
    lVar8 = 0;
    bVar4 = true;
    local_58._0_8_ = lVar23;
    do {
      bVar21 = bVar4;
      uVar18 = (&DAT_006560d0)[lVar8];
      lVar8 = 0;
      local_78._16_8_ = local_78._0_8_;
      bVar4 = true;
      uVar19 = local_78._0_8_;
      uVar26 = uVar18;
      uStack_60 = uVar18;
      do {
        bVar25 = bVar4;
        local_90._16_8_ = (&DAT_006560e0)[lVar8];
        local_90._0_8_ = uVar19;
        local_90._8_8_ = uVar26;
        if (local_90.stencilbufferType == 0 && (GLenum)uVar18 != 0) {
          pIVar11 = (IntersectingQuadsTest *)operator_new(0x98);
          FboCases::IntersectingQuadsTest::IntersectingQuadsTest
                    (pIVar11,(Context *)pTVar7[1]._vptr_TestNode,&local_90,true);
          (pIVar11->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
               = (_func_int **)&PTR__TestCase_0077d0f8;
          tcu::TestNode::addChild(pTVar7,(TestNode *)pIVar11);
          uVar19 = local_78._16_8_;
          uVar26 = uStack_60;
        }
        lVar8 = 1;
        bVar4 = false;
      } while (bVar25);
      bVar4 = false;
    } while (bVar21);
    lVar23 = local_58._0_8_ + 1;
  } while (lVar23 != 5);
  pTVar7 = (TestNode *)operator_new(0x78);
  pTVar6 = local_38;
  pp_Var3 = local_38[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,(TestContext *)*pp_Var3,"stencil","Stencil buffer tests");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00772800;
  pTVar7[1]._vptr_TestNode = pp_Var3;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  lVar23 = 0;
  do {
    local_78._0_8_ = *(undefined8 *)(&DAT_00656040 + lVar23 * 2);
    local_78._8_8_ = 0;
    lVar8 = 0;
    bVar4 = true;
    do {
      bVar21 = bVar4;
      uStack_60 = (&DAT_006560d0)[lVar8];
      local_78._16_8_ = local_78._0_8_;
      lVar8 = 0;
      bVar4 = true;
      do {
        bVar25 = bVar4;
        local_90.colorbufferType = local_78._16_4_;
        local_90.colorbufferFormat = local_78._20_4_;
        local_90.depthbufferType = (GLenum)uStack_60;
        local_90.depthbufferFormat = uStack_60._4_4_;
        local_90._16_8_ = (&DAT_006560e0)[lVar8];
        if (local_90.stencilbufferType != 0) {
          pSVar12 = (StencilTest *)operator_new(0x98);
          FboCases::StencilTest::StencilTest
                    (pSVar12,(Context *)pTVar7[1]._vptr_TestNode,&local_90,false);
          tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar12);
        }
        lVar8 = 1;
        bVar4 = false;
      } while (bVar25);
      bVar4 = false;
    } while (bVar21);
    lVar23 = lVar23 + 1;
  } while (lVar23 != 5);
  lVar23 = 0;
  do {
    local_78._0_8_ = *(undefined8 *)(&DAT_00656040 + lVar23 * 2);
    local_78._8_8_ = 0;
    lVar8 = 0;
    bVar4 = true;
    local_58._0_8_ = lVar23;
    do {
      bVar21 = bVar4;
      uStack_60 = (&DAT_006560d0)[lVar8];
      local_78._16_8_ = local_78._0_8_;
      lVar8 = 0;
      bVar4 = true;
      do {
        bVar25 = bVar4;
        local_90.colorbufferType = local_78._16_4_;
        local_90.colorbufferFormat = local_78._20_4_;
        local_90.depthbufferType = (GLenum)uStack_60;
        local_90.depthbufferFormat = uStack_60._4_4_;
        local_90._16_8_ = (&DAT_006560e0)[lVar8];
        if (local_90.stencilbufferType != 0) {
          pSVar12 = (StencilTest *)operator_new(0x98);
          FboCases::StencilTest::StencilTest
                    (pSVar12,(Context *)pTVar7[1]._vptr_TestNode,&local_90,true);
          (pSVar12->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
               = (_func_int **)&PTR__TestCase_0077d150;
          tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar12);
        }
        lVar8 = 1;
        bVar4 = false;
      } while (bVar25);
      bVar4 = false;
    } while (bVar21);
    lVar23 = local_58._0_8_ + 1;
  } while (lVar23 != 5);
  pTVar7 = (TestNode *)operator_new(0x78);
  pTVar6 = local_38;
  pp_Var3 = local_38[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,(TestContext *)*pp_Var3,"shared_colorbuffer_clear",
             "Shared colorbuffer clears");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00772800;
  pTVar7[1]._vptr_TestNode = pp_Var3;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  lVar23 = 0;
  do {
    local_78._0_8_ = *(undefined8 *)(&DAT_00656040 + lVar23 * 2);
    local_58.depthbufferType = 0;
    local_58.depthbufferFormat = 0;
    lVar8 = 0;
    bVar4 = true;
    local_58._0_8_ = local_78._0_8_;
    local_40 = lVar23;
    do {
      bVar21 = bVar4;
      bVar25 = local_78._0_4_ != 0;
      uVar18 = (&DAT_006560d0)[lVar8];
      GVar5 = (GLenum)uVar18;
      lVar8 = 0;
      local_78._16_4_ = local_58.colorbufferType;
      local_78._20_4_ = local_58.colorbufferFormat;
      bVar4 = true;
      uVar19 = local_58._0_8_;
      uStack_60 = uVar18;
      do {
        bVar20 = bVar4;
        local_90._16_8_ = (&DAT_006560e0)[lVar8];
        local_90._0_8_ = uVar19;
        local_90._8_8_ = uVar18;
        if (local_90.stencilbufferType == 0 && (GVar5 == 0 && bVar25)) {
          pTVar6 = (TestNode *)operator_new(0x90);
          FboCases::SharedColorbufferClearsTest::SharedColorbufferClearsTest
                    ((SharedColorbufferClearsTest *)pTVar6,(Context *)pTVar7[1]._vptr_TestNode,
                     &local_90);
          tcu::TestNode::addChild(pTVar7,pTVar6);
          uVar19 = local_78._16_8_;
          uVar18 = uStack_60;
        }
        lVar8 = 1;
        bVar4 = false;
      } while (bVar20);
      bVar4 = false;
    } while (bVar21);
    lVar23 = local_40 + 1;
  } while (lVar23 != 5);
  pTVar7 = (TestNode *)operator_new(0x78);
  pTVar6 = local_38;
  pp_Var3 = local_38[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,(TestContext *)*pp_Var3,"shared_colorbuffer",
             "Shared colorbuffer tests");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00772800;
  pTVar7[1]._vptr_TestNode = pp_Var3;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  lVar23 = 0;
  do {
    local_78._0_8_ = *(undefined8 *)(&DAT_00656040 + lVar23 * 2);
    local_78._8_8_ = 0;
    lVar8 = 0;
    bVar4 = true;
    do {
      bVar21 = bVar4;
      uStack_60 = (&DAT_006560d0)[lVar8];
      local_78._16_8_ = local_78._0_8_;
      lVar8 = 0;
      bVar4 = true;
      do {
        bVar25 = bVar4;
        local_90.colorbufferType = local_78._16_4_;
        local_90.colorbufferFormat = local_78._20_4_;
        local_90.depthbufferType = (GLenum)uStack_60;
        local_90.depthbufferFormat = uStack_60._4_4_;
        local_90._16_8_ = (&DAT_006560e0)[lVar8];
        pTVar6 = (TestNode *)operator_new(0x90);
        FboCases::SharedColorbufferTest::SharedColorbufferTest
                  ((SharedColorbufferTest *)pTVar6,(Context *)pTVar7[1]._vptr_TestNode,&local_90);
        tcu::TestNode::addChild(pTVar7,pTVar6);
        lVar8 = 1;
        bVar4 = false;
      } while (bVar25);
      bVar4 = false;
    } while (bVar21);
    lVar23 = lVar23 + 1;
  } while (lVar23 != 5);
  pTVar7 = (TestNode *)operator_new(0x78);
  pTVar6 = local_38;
  pp_Var3 = local_38[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,(TestContext *)*pp_Var3,"shared_depthbuffer",
             "Shared depthbuffer tests");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00772800;
  pTVar7[1]._vptr_TestNode = pp_Var3;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  lVar23 = 0;
  do {
    local_78._0_8_ = *(undefined8 *)(&DAT_00656040 + lVar23 * 2);
    local_78._8_8_ = 0;
    lVar8 = 0;
    bVar4 = true;
    local_58._0_8_ = lVar23;
    do {
      bVar21 = bVar4;
      uVar18 = (&DAT_006560d0)[lVar8];
      lVar8 = 0;
      local_78._16_8_ = local_78._0_8_;
      bVar4 = true;
      uVar19 = local_78._0_8_;
      uVar26 = uVar18;
      uStack_60 = uVar18;
      do {
        bVar25 = bVar4;
        local_90._16_8_ = (&DAT_006560e0)[lVar8];
        local_90._0_8_ = uVar19;
        local_90._8_8_ = uVar26;
        if ((GLenum)uVar18 == 0x8d41) {
          pTVar6 = (TestNode *)operator_new(0x90);
          FboCases::SharedDepthbufferTest::SharedDepthbufferTest
                    ((SharedDepthbufferTest *)pTVar6,(Context *)pTVar7[1]._vptr_TestNode,&local_90);
          tcu::TestNode::addChild(pTVar7,pTVar6);
          uVar19 = local_78._16_8_;
          uVar26 = uStack_60;
        }
        lVar8 = 1;
        bVar4 = false;
      } while (bVar25);
      bVar4 = false;
    } while (bVar21);
    lVar23 = local_58._0_8_ + 1;
  } while (lVar23 != 5);
  pTVar7 = (TestNode *)operator_new(0x78);
  pTVar6 = local_38;
  pp_Var3 = local_38[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,(TestContext *)*pp_Var3,"resize","FBO resize tests");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00772800;
  pTVar7[1]._vptr_TestNode = pp_Var3;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  lVar23 = 0;
  do {
    local_78._0_8_ = *(undefined8 *)(&DAT_00656040 + lVar23 * 2);
    local_78._8_8_ = 0;
    lVar8 = 0;
    bVar4 = true;
    do {
      bVar21 = bVar4;
      uStack_60 = (&DAT_006560d0)[lVar8];
      local_78._16_8_ = local_78._0_8_;
      lVar8 = 0;
      bVar4 = true;
      do {
        bVar25 = bVar4;
        local_90.colorbufferType = local_78._16_4_;
        local_90.colorbufferFormat = local_78._20_4_;
        local_90.depthbufferType = (GLenum)uStack_60;
        local_90.depthbufferFormat = uStack_60._4_4_;
        local_90._16_8_ = (&DAT_006560e0)[lVar8];
        pTVar6 = (TestNode *)operator_new(0x90);
        FboCases::ResizeTest::ResizeTest
                  ((ResizeTest *)pTVar6,(Context *)pTVar7[1]._vptr_TestNode,&local_90);
        tcu::TestNode::addChild(pTVar7,pTVar6);
        lVar8 = 1;
        bVar4 = false;
      } while (bVar25);
      bVar4 = false;
    } while (bVar21);
    lVar23 = lVar23 + 1;
  } while (lVar23 != 5);
  pTVar7 = (TestNode *)operator_new(0x78);
  pTVar6 = local_38;
  pp_Var3 = local_38[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,(TestContext *)*pp_Var3,"recreate_colorbuffer",
             "Recreate colorbuffer tests");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00772800;
  pTVar7[1]._vptr_TestNode = pp_Var3;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  local_40 = 0;
  do {
    uVar18 = *(undefined8 *)(&DAT_00656040 + local_40 * 2);
    local_58.depthbufferType = 0;
    local_58.depthbufferFormat = 0;
    uVar19 = CONCAT71((int7)((ulong)local_40 >> 8),1);
    lVar23 = 0;
    local_58._0_8_ = uVar18;
    do {
      local_78._0_4_ = (int)uVar19;
      uStack_60 = (&DAT_006560d0)[lVar23];
      local_78._16_4_ = local_58.colorbufferType;
      local_78._20_4_ = local_58.colorbufferFormat;
      lVar23 = 0;
      bVar4 = true;
      do {
        bVar21 = bVar4;
        local_90.colorbufferType = local_78._16_4_;
        local_90.colorbufferFormat = local_78._20_4_;
        local_90.depthbufferType = (GLenum)uStack_60;
        local_90.depthbufferFormat = uStack_60._4_4_;
        local_90._16_8_ = (&DAT_006560e0)[lVar23];
        if ((GLenum)uVar18 != 0) {
          pRVar13 = (RecreateBuffersTest<16384U> *)operator_new(0x98);
          FboCases::RecreateBuffersTest<16384U>::RecreateBuffersTest
                    (pRVar13,(Context *)pTVar7[1]._vptr_TestNode,&local_90,true);
          (pRVar13->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
               = (_func_int **)&PTR__TestCase_0077d1a8;
          tcu::TestNode::addChild(pTVar7,(TestNode *)pRVar13);
        }
        lVar23 = 1;
        bVar4 = false;
      } while (bVar21);
      uVar19 = 0;
    } while ((local_78._0_8_ & 1) != 0);
    local_40 = local_40 + 1;
  } while (local_40 != 5);
  lVar23 = 0;
  do {
    uVar18 = *(undefined8 *)(&DAT_00656040 + lVar23 * 2);
    local_58.depthbufferType = 0;
    local_58.depthbufferFormat = 0;
    uVar19 = CONCAT71((int7)((ulong)lVar23 >> 8),1);
    lVar8 = 0;
    local_58._0_8_ = uVar18;
    local_40 = lVar23;
    do {
      local_78._0_4_ = (int)uVar19;
      uStack_60 = (&DAT_006560d0)[lVar8];
      local_78._16_4_ = local_58.colorbufferType;
      local_78._20_4_ = local_58.colorbufferFormat;
      lVar8 = 0;
      bVar4 = true;
      do {
        bVar21 = bVar4;
        local_90.colorbufferType = local_78._16_4_;
        local_90.colorbufferFormat = local_78._20_4_;
        local_90.depthbufferType = (GLenum)uStack_60;
        local_90.depthbufferFormat = uStack_60._4_4_;
        local_90._16_8_ = (&DAT_006560e0)[lVar8];
        if ((GLenum)uVar18 != 0) {
          pRVar13 = (RecreateBuffersTest<16384U> *)operator_new(0x98);
          FboCases::RecreateBuffersTest<16384U>::RecreateBuffersTest
                    (pRVar13,(Context *)pTVar7[1]._vptr_TestNode,&local_90,false);
          (pRVar13->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
               = (_func_int **)&PTR__TestCase_0077d258;
          tcu::TestNode::addChild(pTVar7,(TestNode *)pRVar13);
        }
        lVar8 = 1;
        bVar4 = false;
      } while (bVar21);
      uVar19 = 0;
    } while ((local_78._0_8_ & 1) != 0);
    lVar23 = local_40 + 1;
  } while (lVar23 != 5);
  pTVar7 = (TestNode *)operator_new(0x78);
  pTVar6 = local_38;
  pp_Var3 = local_38[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,(TestContext *)*pp_Var3,"recreate_depthbuffer",
             "Recreate depthbuffer tests");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00772800;
  pTVar7[1]._vptr_TestNode = pp_Var3;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  local_40 = 0;
  do {
    local_58._0_8_ = *(undefined8 *)(&DAT_00656040 + local_40 * 2);
    local_58.depthbufferType = 0;
    local_58.depthbufferFormat = 0;
    uVar18 = CONCAT71((int7)((ulong)local_40 >> 8),1);
    lVar23 = 0;
    do {
      local_78._0_4_ = (int)uVar18;
      uVar18 = (&DAT_006560d0)[lVar23];
      local_78._16_4_ = local_58.colorbufferType;
      local_78._20_4_ = local_58.colorbufferFormat;
      lVar23 = 0;
      bVar4 = true;
      uStack_60 = uVar18;
      do {
        bVar21 = bVar4;
        local_90.colorbufferType = local_78._16_4_;
        local_90.colorbufferFormat = local_78._20_4_;
        local_90.depthbufferType = (GLenum)uStack_60;
        local_90.depthbufferFormat = uStack_60._4_4_;
        local_90._16_8_ = (&DAT_006560e0)[lVar23];
        if ((GLenum)uVar18 != 0) {
          pRVar14 = (RecreateBuffersTest<256U> *)operator_new(0x98);
          FboCases::RecreateBuffersTest<256U>::RecreateBuffersTest
                    (pRVar14,(Context *)pTVar7[1]._vptr_TestNode,&local_90,true);
          (pRVar14->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
               = (_func_int **)&PTR__TestCase_0077d2b0;
          tcu::TestNode::addChild(pTVar7,(TestNode *)pRVar14);
        }
        lVar23 = 1;
        bVar4 = false;
      } while (bVar21);
      uVar18 = 0;
    } while ((local_78._0_8_ & 1) != 0);
    local_40 = local_40 + 1;
  } while (local_40 != 5);
  lVar23 = 0;
  do {
    local_58._0_8_ = *(undefined8 *)(&DAT_00656040 + lVar23 * 2);
    local_58.depthbufferType = 0;
    local_58.depthbufferFormat = 0;
    uVar18 = CONCAT71((int7)((ulong)lVar23 >> 8),1);
    lVar8 = 0;
    local_40 = lVar23;
    do {
      local_78._0_4_ = (int)uVar18;
      uVar18 = (&DAT_006560d0)[lVar8];
      local_78._16_4_ = local_58.colorbufferType;
      local_78._20_4_ = local_58.colorbufferFormat;
      lVar8 = 0;
      bVar4 = true;
      uStack_60 = uVar18;
      do {
        bVar21 = bVar4;
        local_90.colorbufferType = local_78._16_4_;
        local_90.colorbufferFormat = local_78._20_4_;
        local_90.depthbufferType = (GLenum)uStack_60;
        local_90.depthbufferFormat = uStack_60._4_4_;
        local_90._16_8_ = (&DAT_006560e0)[lVar8];
        if ((GLenum)uVar18 != 0) {
          pRVar14 = (RecreateBuffersTest<256U> *)operator_new(0x98);
          FboCases::RecreateBuffersTest<256U>::RecreateBuffersTest
                    (pRVar14,(Context *)pTVar7[1]._vptr_TestNode,&local_90,false);
          (pRVar14->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
               = (_func_int **)&PTR__TestCase_0077d360;
          tcu::TestNode::addChild(pTVar7,(TestNode *)pRVar14);
        }
        lVar8 = 1;
        bVar4 = false;
      } while (bVar21);
      uVar18 = 0;
    } while ((local_78._0_8_ & 1) != 0);
    lVar23 = local_40 + 1;
  } while (lVar23 != 5);
  pTVar7 = (TestNode *)operator_new(0x78);
  pTVar6 = local_38;
  pp_Var3 = local_38[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,(TestContext *)*pp_Var3,"recreate_stencilbuffer",
             "Recreate stencilbuffer tests");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00772800;
  pTVar7[1]._vptr_TestNode = pp_Var3;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  local_58._0_8_ = 0;
  do {
    local_78._0_8_ = *(undefined8 *)(&DAT_00656040 + local_58._0_8_ * 2);
    local_78._8_8_ = 0;
    lVar23 = 0;
    bVar4 = true;
    do {
      bVar21 = bVar4;
      uStack_60 = (&DAT_006560d0)[lVar23];
      local_78._16_8_ = local_78._0_8_;
      lVar23 = 0;
      bVar4 = true;
      do {
        bVar25 = bVar4;
        local_90.colorbufferType = local_78._16_4_;
        local_90.colorbufferFormat = local_78._20_4_;
        local_90.depthbufferType = (GLenum)uStack_60;
        local_90.depthbufferFormat = uStack_60._4_4_;
        local_90._16_8_ = (&DAT_006560e0)[lVar23];
        if (local_90.stencilbufferType != 0) {
          pRVar15 = (RecreateBuffersTest<1024U> *)operator_new(0x98);
          FboCases::RecreateBuffersTest<1024U>::RecreateBuffersTest
                    (pRVar15,(Context *)pTVar7[1]._vptr_TestNode,&local_90,true);
          (pRVar15->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
               = (_func_int **)&PTR__TestCase_0077d3b8;
          tcu::TestNode::addChild(pTVar7,(TestNode *)pRVar15);
        }
        lVar23 = 1;
        bVar4 = false;
      } while (bVar25);
      bVar4 = false;
    } while (bVar21);
    local_58._0_8_ = local_58._0_8_ + 1;
  } while (local_58._0_8_ != 5);
  lVar23 = 0;
  do {
    local_78._0_8_ = *(undefined8 *)(&DAT_00656040 + lVar23 * 2);
    local_78._8_8_ = 0;
    lVar8 = 0;
    bVar4 = true;
    local_58._0_8_ = lVar23;
    do {
      bVar21 = bVar4;
      uStack_60 = (&DAT_006560d0)[lVar8];
      local_78._16_8_ = local_78._0_8_;
      lVar8 = 0;
      bVar4 = true;
      do {
        bVar25 = bVar4;
        local_90.colorbufferType = local_78._16_4_;
        local_90.colorbufferFormat = local_78._20_4_;
        local_90.depthbufferType = (GLenum)uStack_60;
        local_90.depthbufferFormat = uStack_60._4_4_;
        local_90._16_8_ = (&DAT_006560e0)[lVar8];
        if (local_90.stencilbufferType != 0) {
          pRVar15 = (RecreateBuffersTest<1024U> *)operator_new(0x98);
          FboCases::RecreateBuffersTest<1024U>::RecreateBuffersTest
                    (pRVar15,(Context *)pTVar7[1]._vptr_TestNode,&local_90,false);
          (pRVar15->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
               = (_func_int **)&PTR__TestCase_0077d468;
          tcu::TestNode::addChild(pTVar7,(TestNode *)pRVar15);
        }
        lVar8 = 1;
        bVar4 = false;
      } while (bVar25);
      bVar4 = false;
    } while (bVar21);
    lVar23 = local_58._0_8_ + 1;
  } while (lVar23 != 5);
  pTVar7 = (TestNode *)operator_new(0x78);
  pTVar6 = local_38;
  pp_Var3 = local_38[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,(TestContext *)*pp_Var3,"texsubimage",
             "TexSubImage interop with FBO colorbuffer texture");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00772800;
  pTVar7[1]._vptr_TestNode = pp_Var3;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  local_40 = 0;
  do {
    GVar5 = (&DAT_00656040)[local_40 * 2];
    GVar1 = (&DAT_00656044)[local_40 * 2];
    uVar17 = GVar1 - 0x1907;
    local_58.colorbufferType._0_1_ = uVar17 < 2 && GVar5 == 0xde1;
    uVar18 = CONCAT71((uint7)(uint3)(uVar17 >> 8),1);
    lVar23 = 0;
    do {
      local_78._0_4_ = (int)uVar18;
      local_90._8_8_ = (&DAT_006560d0)[lVar23];
      bVar24 = local_90.depthbufferType == 0 & (byte)local_58.colorbufferType;
      lVar23 = 0;
      uStack_60 = 0;
      bVar4 = true;
      local_78._16_8_ = local_90._8_8_;
      do {
        bVar21 = bVar4;
        local_90.colorbufferFormat = GVar1;
        local_90.colorbufferType = GVar5;
        local_90._16_8_ = (&DAT_006560e0)[lVar23];
        if ((local_90.stencilbufferType == 0 & bVar24) == 1) {
          pTVar6 = (TestNode *)operator_new(0x90);
          FboCases::TexSubImageAfterRenderTest::TexSubImageAfterRenderTest
                    ((TexSubImageAfterRenderTest *)pTVar6,(Context *)pTVar7[1]._vptr_TestNode,
                     &local_90);
          tcu::TestNode::addChild(pTVar7,pTVar6);
          local_90._8_8_ = local_78._16_8_;
        }
        lVar23 = 1;
        bVar4 = false;
      } while (bVar21);
      uVar18 = 0;
    } while ((local_78._0_8_ & 1) != 0);
    local_40 = local_40 + 1;
  } while (local_40 != 5);
  lVar23 = 0;
  do {
    GVar5 = (&DAT_00656040)[lVar23 * 2];
    GVar1 = (&DAT_00656044)[lVar23 * 2];
    uVar17 = GVar1 - 0x1907;
    local_58.colorbufferType._0_1_ = uVar17 < 2 && GVar5 == 0xde1;
    uVar18 = CONCAT71((uint7)(uint3)(uVar17 >> 8),1);
    lVar8 = 0;
    local_40 = lVar23;
    do {
      local_78._0_4_ = (int)uVar18;
      uVar18 = (&DAT_006560d0)[lVar8];
      bVar24 = (GLenum)uVar18 == 0 & (byte)local_58.colorbufferType;
      lVar8 = 0;
      uStack_60 = 0;
      bVar4 = true;
      local_78._16_8_ = uVar18;
      do {
        bVar21 = bVar4;
        local_90.colorbufferFormat = GVar1;
        local_90.colorbufferType = GVar5;
        local_90._16_8_ = (&DAT_006560e0)[lVar8];
        local_90._8_8_ = uVar18;
        if ((local_90.stencilbufferType == 0 & bVar24) == 1) {
          pTVar6 = (TestNode *)operator_new(0x90);
          FboCases::TexSubImageBetweenRenderTest::TexSubImageBetweenRenderTest
                    ((TexSubImageBetweenRenderTest *)pTVar6,(Context *)pTVar7[1]._vptr_TestNode,
                     &local_90);
          tcu::TestNode::addChild(pTVar7,pTVar6);
          uVar18 = local_78._16_8_;
        }
        lVar8 = 1;
        bVar4 = false;
      } while (bVar21);
      uVar18 = 0;
    } while ((local_78._0_8_ & 1) != 0);
    lVar23 = local_40 + 1;
  } while (lVar23 != 5);
  pTVar7 = (TestNode *)operator_new(0x70);
  pTVar6 = local_38;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,local_38->m_testCtx,"repeated_clear","Repeated FBO clears");
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pTVar16 = (TestNode *)operator_new(0x90);
  FboCases::RepeatedClearCase::RepeatedClearCase
            ((RepeatedClearCase *)pTVar16,(Context *)pTVar6[1]._vptr_TestNode,0x1907);
  tcu::TestNode::addChild(pTVar7,pTVar16);
  pTVar16 = (TestNode *)operator_new(0x90);
  FboCases::RepeatedClearCase::RepeatedClearCase
            ((RepeatedClearCase *)pTVar16,(Context *)pTVar6[1]._vptr_TestNode,0x1908);
  tcu::TestNode::addChild(pTVar7,pTVar16);
  return extraout_EAX;
}

Assistant:

void FboRenderTestGroup::init (void)
{
	createChildGroup<FboCases::ColorClearsTest>					(this, "color_clear",		"Color buffer clears");
	createChildGroup<FboCases::StencilClearsTest>				(this, "stencil_clear",		"Stencil buffer clears");

	deqp::gles2::TestCaseGroup* colorGroup = new deqp::gles2::TestCaseGroup(m_context, "color", "Color buffer tests");
	addChild(colorGroup);
	addChildVariants<FboCases::MixTest>			(colorGroup);
	addChildVariants<FboCases::MixNpotTest>		(colorGroup);
	addChildVariants<FboCases::BlendTest>		(colorGroup);
	addChildVariants<FboCases::BlendNpotTest>	(colorGroup);

	deqp::gles2::TestCaseGroup* depthGroup = new deqp::gles2::TestCaseGroup(m_context, "depth", "Depth bufer tests");
	addChild(depthGroup);
	addChildVariants<FboCases::IntersectingQuadsTest>		(depthGroup);
	addChildVariants<FboCases::IntersectingQuadsNpotTest>	(depthGroup);

	deqp::gles2::TestCaseGroup* stencilGroup = new deqp::gles2::TestCaseGroup(m_context, "stencil", "Stencil buffer tests");
	addChild(stencilGroup);
	addChildVariants<FboCases::StencilTest>		(stencilGroup);
	addChildVariants<FboCases::StencilNpotTest>	(stencilGroup);

	createChildGroup<FboCases::SharedColorbufferClearsTest>		(this, "shared_colorbuffer_clear",	"Shared colorbuffer clears");
	createChildGroup<FboCases::SharedColorbufferTest>			(this, "shared_colorbuffer",		"Shared colorbuffer tests");
	createChildGroup<FboCases::SharedDepthbufferTest>			(this, "shared_depthbuffer",		"Shared depthbuffer tests");
	createChildGroup<FboCases::ResizeTest>						(this, "resize",					"FBO resize tests");

	createRecreateBuffersGroup<GL_COLOR_BUFFER_BIT>				(this, "recreate_colorbuffer",		"Recreate colorbuffer tests");
	createRecreateBuffersGroup<GL_DEPTH_BUFFER_BIT>				(this, "recreate_depthbuffer",		"Recreate depthbuffer tests");
	createRecreateBuffersGroup<GL_STENCIL_BUFFER_BIT>			(this, "recreate_stencilbuffer",	"Recreate stencilbuffer tests");

	deqp::gles2::TestCaseGroup* texSubImageGroup = new deqp::gles2::TestCaseGroup(m_context, "texsubimage", "TexSubImage interop with FBO colorbuffer texture");
	addChild(texSubImageGroup);
	addChildVariants<FboCases::TexSubImageAfterRenderTest>		(texSubImageGroup);
	addChildVariants<FboCases::TexSubImageBetweenRenderTest>	(texSubImageGroup);

	{
		tcu::TestCaseGroup* const repeatedClearGroup = new tcu::TestCaseGroup(m_testCtx, "repeated_clear", "Repeated FBO clears");
		addChild(repeatedClearGroup);

		repeatedClearGroup->addChild(new FboCases::RepeatedClearCase(m_context, GL_RGB));
		repeatedClearGroup->addChild(new FboCases::RepeatedClearCase(m_context, GL_RGBA));
	}
}